

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindGenericRoundFunctionDecimal<duckdb::RoundDecimalOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *pLVar1;
  Expression EVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  uchar uVar6;
  reference this_00;
  pointer pEVar7;
  reference pvVar8;
  code *__f;
  LogicalType local_48;
  undefined1 local_47;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  pLVar1 = (LogicalType *)(pEVar7 + 0x38);
  cVar5 = duckdb::DecimalType::GetScale(pLVar1);
  uVar6 = duckdb::DecimalType::GetWidth(pLVar1);
  if (cVar5 == '\0') {
    __f = duckdb::ScalarFunction::NopFunction;
  }
  else {
    EVar2 = pEVar7[0x39];
    if (EVar2 == (Expression)0x9) {
      __f = GenericRoundFunctionDecimal<long,duckdb::NumericHelper,duckdb::RoundDecimalOperator>;
    }
    else if (EVar2 == (Expression)0x7) {
      __f = GenericRoundFunctionDecimal<int,duckdb::NumericHelper,duckdb::RoundDecimalOperator>;
    }
    else if (EVar2 == (Expression)0x5) {
      __f = GenericRoundFunctionDecimal<short,duckdb::NumericHelper,duckdb::RoundDecimalOperator>;
    }
    else {
      __f = 
      GenericRoundFunctionDecimal<duckdb::hugeint_t,duckdb::Hugeint,duckdb::RoundDecimalOperator>;
    }
  }
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
  pvVar8 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
  if (pvVar8 != pLVar1) {
    *pvVar8 = (value_type)pEVar7[0x38];
    *(Expression *)(pvVar8 + 1) = pEVar7[0x39];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar8 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar7 + 0x40));
  }
  duckdb::LogicalType::DECIMAL((uchar)&local_48,uVar6);
  bound_function->field_0x90 = local_48;
  bound_function->field_0x91 = local_47;
  uVar3 = *(undefined8 *)&bound_function->field_0x98;
  uVar4 = *(undefined8 *)&bound_function->field_0xa0;
  *(undefined8 *)&bound_function->field_0x98 = local_40;
  *(undefined8 *)&bound_function->field_0xa0 = uStack_38;
  local_40 = uVar3;
  uStack_38 = uVar4;
  duckdb::LogicalType::~LogicalType(&local_48);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindGenericRoundFunctionDecimal(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments) {
	// ceil essentially removes the scale
	auto &decimal_type = arguments[0]->return_type;
	auto scale = DecimalType::GetScale(decimal_type);
	auto width = DecimalType::GetWidth(decimal_type);
	if (scale == 0) {
		bound_function.function = ScalarFunction::NopFunction;
	} else {
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = GenericRoundFunctionDecimal<int16_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT32:
			bound_function.function = GenericRoundFunctionDecimal<int32_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT64:
			bound_function.function = GenericRoundFunctionDecimal<int64_t, NumericHelper, OP>;
			break;
		default:
			bound_function.function = GenericRoundFunctionDecimal<hugeint_t, Hugeint, OP>;
			break;
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, 0);
	return nullptr;
}